

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.h
# Opt level: O3

void __thiscall bsplib::Rdma::~Rdma(Rdma *this)

{
  pointer puVar1;
  pointer pPVar2;
  pointer pAVar3;
  pointer ppvVar4;
  pointer pMVar5;
  
  puVar1 = (this->m_recv_push_pop_comm_buf).m_popped_slots.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->m_recv_push_pop_comm_buf).m_popped_slots.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  pPVar2 = (this->m_recv_push_pop_comm_buf).m_pushed_slots.
           super__Vector_base<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pPVar2 != (pointer)0x0) {
    operator_delete(pPVar2,(long)(this->m_recv_push_pop_comm_buf).m_pushed_slots.
                                 super__Vector_base<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pPVar2);
  }
  puVar1 = (this->m_send_push_pop_comm_buf).m_popped_slots.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->m_send_push_pop_comm_buf).m_popped_slots.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  pPVar2 = (this->m_send_push_pop_comm_buf).m_pushed_slots.
           super__Vector_base<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pPVar2 != (pointer)0x0) {
    operator_delete(pPVar2,(long)(this->m_send_push_pop_comm_buf).m_pushed_slots.
                                 super__Vector_base<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pPVar2);
  }
  Unbuf::~Unbuf(&this->m_unbuf);
  puVar1 = (this->m_recv_actions).m_get_buffer_offset.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->m_recv_actions).m_get_buffer_offset.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  puVar1 = (this->m_recv_actions).m_counts.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->m_recv_actions).m_counts.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  pAVar3 = (this->m_recv_actions).m_actions.
           super__Vector_base<bsplib::Rdma::Action,_std::allocator<bsplib::Rdma::Action>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pAVar3 != (pointer)0x0) {
    operator_delete(pAVar3,(long)(this->m_recv_actions).m_actions.
                                 super__Vector_base<bsplib::Rdma::Action,_std::allocator<bsplib::Rdma::Action>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pAVar3);
  }
  puVar1 = (this->m_send_actions).m_get_buffer_offset.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->m_send_actions).m_get_buffer_offset.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  puVar1 = (this->m_send_actions).m_counts.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->m_send_actions).m_counts.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  pAVar3 = (this->m_send_actions).m_actions.
           super__Vector_base<bsplib::Rdma::Action,_std::allocator<bsplib::Rdma::Action>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pAVar3 != (pointer)0x0) {
    operator_delete(pAVar3,(long)(this->m_send_actions).m_actions.
                                 super__Vector_base<bsplib::Rdma::Action,_std::allocator<bsplib::Rdma::Action>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pAVar3);
  }
  ppvVar4 = (this->m_local_slots).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppvVar4 != (pointer)0x0) {
    operator_delete(ppvVar4,(long)(this->m_local_slots).
                                  super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage - (long)ppvVar4);
  }
  puVar1 = (this->m_free_slots).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->m_free_slots).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  pMVar5 = (this->m_used_slots).
           super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pMVar5 != (pointer)0x0) {
    operator_delete(pMVar5,(long)(this->m_used_slots).
                                 super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pMVar5);
  }
  std::
  _Hashtable<void_*,_std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->m_register)._M_h);
  A2A::~A2A(&this->m_second_exchange);
  A2A::~A2A(&this->m_first_exchange);
  return;
}

Assistant:

class DLL_LOCAL Rdma { 
public:
    struct Memblock {
        void * addr;
        size_t size;
        enum Status { NORMAL=0x0, PUSHED=0x1, POPPED=0x2 };
        unsigned status;
    };
    typedef size_t Memslot;

    Rdma( MPI_Comm comm , size_t max_msg_size, size_t small_exch_size,
       double alpha, double beta, size_t min_n_hp_msg_size,
       A2A::Method method );
    
    void push_reg( void * addr, size_t size );
    void pop_reg( Memslot slot );

    static Memslot no_slot() { return Memslot(-1); }
    static Memslot null_slot() { return Memslot(-2); }

    Memslot lookup_reg( const void * addr, bool pushed, bool popped ) const
    {   
        if (addr == NULL ) return null_slot();
        
        if ( m_cached_slot != no_slot() 
                && slot( m_pid, m_cached_slot).addr == addr
                && slot( m_pid, m_cached_slot).status == Memblock::NORMAL )
            return m_cached_slot;

        Reg::const_iterator i = m_register.find( const_cast<void*>(addr) );
        if (i != m_register.end()) {
            for (RRSIt j = i->second.rbegin(); j != i->second.rend(); ++j) {
                unsigned status  = slot( m_pid, *j ).status ;
                if ( status == unsigned(Memblock::NORMAL))  {
                    m_cached_slot = *j;
                    return m_cached_slot;
                }
                if ( pushed == bool (status & Memblock::PUSHED)
                  &&  popped == bool (status & Memblock::POPPED)) {
                    return *j;
                }
                             
            }
        }
        return no_slot(); 
    }

    const Memblock & slot( int pid, Memslot slot ) const
    { return m_used_slots[ slot * m_nprocs + pid ]; }

    Memblock & slot( int pid, Memslot slot )
    { return m_used_slots[ slot * m_nprocs + pid ]; }

    void put( const void * src, int dst_pid, Memslot dst_slot, size_t dst_offset,
            size_t size );

    void hpput( const void * src, int dst_pid, Memslot dst_slot, size_t dst_offset,
            size_t size );

    void get( int src_pid, Memslot src_slot, size_t src_offset, void * dst,
            size_t size );

    void hpget( int src_pid, Memslot src_slot, size_t src_offset, void * dst,
            size_t size );

    bool sync( bool dummy_bsmp );

private:
    typedef std::list< Memslot > RegStack;
    typedef RegStack :: const_iterator RSIt;
    typedef RegStack :: const_reverse_iterator RRSIt;

#ifdef HAS_CXX11_UNORDERED_MAP
    typedef std::unordered_map< void * , RegStack > Reg;
#else
    typedef std::tr1::unordered_map< void *, RegStack > Reg;
#endif
    A2A m_first_exchange;
    A2A m_second_exchange;
    int m_pid, m_nprocs;
    size_t m_min_n_hp_msg_size;
    Reg m_register;
    std::vector< Memblock > m_used_slots;
    std::vector< Memslot > m_free_slots;
    mutable Memslot m_cached_slot;
    std::vector< void * > m_local_slots;
 
    struct Action { 
        enum Kind { GET, HPPUT, HPGET } kind; 
        int target_pid, src_pid, dst_pid, tag;
        Memslot src_slot, dst_slot;
        size_t offset, size;
    };

    struct ActionBuf {
        ActionBuf( int nprocs )
            : m_actions()
            , m_counts( nprocs )
            , m_get_buffer_offset( nprocs )
        {}

        std::vector< Action > m_actions;
        std::vector< size_t > m_counts;
        std::vector< size_t > m_get_buffer_offset;
        unsigned m_dummy_bsmp;

        void push_back( const Action & action )
        {   
            m_actions.push_back( action );
            m_counts[ action.target_pid ] += 1;
        }

        void set_get_buffer_offset( A2A & buf ) 
        {
            for ( int p = 0; p < buf.nprocs(); ++p ) 
                m_get_buffer_offset[ p ] = buf.send_size( p );
        }

        void set_dummy_bsmp( bool dummy )
        { m_dummy_bsmp = dummy; }

        bool get_dummy_bsmp()
        { return m_dummy_bsmp; }

        void serialize( A2A & a2a );
        void deserialize( A2A & a2a );
        void execute( Rdma & rdma );
      
        void clear() 
        {
            m_dummy_bsmp = false;
            m_actions.clear();
            std::fill( m_counts.begin(), m_counts.end(), 0);
            std::fill( m_get_buffer_offset.begin(), m_get_buffer_offset.end(), 0);
        }
    };

    ActionBuf m_send_actions;
    ActionBuf m_recv_actions;
        

    /// Unbuffered communications
    Unbuf m_unbuf;
    
    // Comm structure to exchange push & pop of registers 
    struct PushPopCommBuf {
        struct PushEntry { Memblock block; Memslot slot; };
        std::vector< PushEntry > m_pushed_slots;
        std::vector< Memslot >   m_popped_slots;
        
        void clear()
        { m_pushed_slots.clear(); m_popped_slots.clear(); }

        void serialize( A2A & a2a );
        void deserialize( A2A & a2a );
        void execute( Rdma & rdma );
    };
    PushPopCommBuf m_send_push_pop_comm_buf;
    PushPopCommBuf m_recv_push_pop_comm_buf;

    void write_gets();
    void write_puts();

#ifdef PROFILE
    TicToc m_tictoc;
#endif
}